

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O0

Id dxil_spv::build_load_invocation_id(Impl *impl)

{
  Id arg;
  Id type_id;
  Builder *this;
  Operation *this_00;
  Operation *op;
  Id var_id;
  Builder *builder;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  arg = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInInvocationId);
  type_id = spv::Builder::makeUintType(this,0x20);
  this_00 = Converter::Impl::allocate(impl,OpLoad,type_id);
  Operation::add_id(this_00,arg);
  Converter::Impl::add(impl,this_00,false);
  return this_00->id;
}

Assistant:

spv::Id build_load_invocation_id(Converter::Impl &impl)
{
	auto &builder = impl.builder();
	spv::Id var_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInInvocationId);

	Operation *op = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	op->add_id(var_id);

	impl.add(op);
	return op->id;
}